

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode urldecode_host(dynbuf *host)

{
  CURLcode CVar1;
  CURLUcode CVar2;
  char *__s;
  char *pcVar3;
  char *decoded;
  size_t dlen;
  char *local_20;
  size_t local_18;
  
  __s = Curl_dyn_ptr(host);
  pcVar3 = strchr(__s,0x25);
  if (pcVar3 == (char *)0x0) {
    CVar2 = CURLUE_OK;
  }
  else {
    CVar1 = Curl_urldecode(__s,0,&local_20,&local_18,REJECT_CTRL);
    CVar2 = CURLUE_BAD_HOSTNAME;
    if (CVar1 == CURLE_OK) {
      Curl_dyn_reset(host);
      CVar1 = Curl_dyn_addn(host,local_20,local_18);
      (*Curl_cfree)(local_20);
      CVar2 = CURLUE_OK;
      if ((CVar1 != CURLE_OK) && (CVar2 = CURLUE_OUT_OF_MEMORY, CVar1 == CURLE_TOO_LARGE)) {
        CVar2 = CURLUE_TOO_LARGE;
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLUcode urldecode_host(struct dynbuf *host)
{
  char *per = NULL;
  const char *hostname = Curl_dyn_ptr(host);
  per = strchr(hostname, '%');
  if(!per)
    /* nothing to decode */
    return CURLUE_OK;
  else {
    /* encoded */
    size_t dlen;
    char *decoded;
    CURLcode result = Curl_urldecode(hostname, 0, &decoded, &dlen,
                                     REJECT_CTRL);
    if(result)
      return CURLUE_BAD_HOSTNAME;
    Curl_dyn_reset(host);
    result = Curl_dyn_addn(host, decoded, dlen);
    free(decoded);
    if(result)
      return cc2cu(result);
  }

  return CURLUE_OK;
}